

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall
soul::heart::Parser::scanBlocks(Parser *this,FunctionParseState *state,FunctionBuilder *builder)

{
  bool bVar1;
  Block *pBVar2;
  Module *this_00;
  Variable *o;
  Identifier *args;
  undefined1 local_120 [16];
  char *local_110;
  char *local_108;
  int local_fc;
  char *local_f8;
  Role local_ec;
  pool_ref<soul::heart::Variable> local_e8;
  Identifier local_e0;
  Identifier paramName;
  CodeLocation paramLocation;
  Type paramType;
  Block *block;
  CompileMessage local_80;
  reference local_48;
  BlockCode *b;
  iterator __end3;
  iterator __begin3;
  vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  *__range3;
  Identifier name;
  FunctionBuilder *builder_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  name.name = (string *)builder;
  do {
    __range3 = (vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
                *)parseBlockName(this);
    __end3 = std::
             vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
             ::begin(&state->blocks);
    b = (BlockCode *)
        std::
        vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
        ::end(&state->blocks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<soul::FunctionParseState::BlockCode_*,_std::vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>_>
                                       *)&b), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<soul::FunctionParseState::BlockCode_*,_std::vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>_>
                 ::operator*(&__end3);
      bVar1 = Identifier::operator==(&local_48->block->name,(Identifier *)&__range3);
      if (bVar1) {
        Errors::nameInUse<soul::Identifier&>(&local_80,(Errors *)&__range3,args);
        (*(this->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])(this,&local_80);
        CompileMessage::~CompileMessage(&local_80);
      }
      __gnu_cxx::
      __normal_iterator<soul::FunctionParseState::BlockCode_*,_std::vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>_>
      ::operator++(&__end3);
    }
    pBVar2 = FunctionBuilder::createBlock((FunctionBuilder *)name.name,(Identifier)__range3);
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x4d4496);
    if ((bVar1) &&
       (bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x4d2078), !bVar1)) {
      do {
        readValueOrRefType((Type *)&paramLocation.location,this);
        CodeLocation::CodeLocation
                  ((CodeLocation *)&paramName,
                   &(this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ).location);
        local_e0 = parseVariableIdentifier(this);
        this_00 = pool_ptr<soul::Module>::operator->(&this->module);
        local_ec = parameter;
        o = Module::
            allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                      (this_00,(CodeLocation *)&paramName,(Type *)&paramLocation.location,&local_e0,
                       &local_ec);
        pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>(&local_e8,o);
        std::
        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
        ::push_back(&pBVar2->parameters,&local_e8);
        pool_ref<soul::heart::Variable>::~pool_ref(&local_e8);
        local_f8 = ",";
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)",");
        if (bVar1) {
          local_fc = 7;
        }
        else {
          local_108 = ")";
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::expect<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4d2078);
          local_fc = 6;
        }
        CodeLocation::~CodeLocation((CodeLocation *)&paramName);
        Type::~Type((Type *)&paramLocation.location);
      } while (local_fc != 6);
    }
    local_110 = ":";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x4ae19c);
    local_120._0_8_ = pBVar2;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    getCurrentTokeniserPosition
              ((Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                *)(local_120 + 8));
    std::
    vector<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
    ::push_back(&state->blocks,(value_type *)local_120);
    skipPastNextOccurrenceOf(this,(TokenType)0x4ad30b);
    while (bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ::matches(&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,(TokenType)"$blockIdentifier"), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x4ad7e6);
      if (bVar1) {
        return;
      }
      skipPastNextOccurrenceOf(this,(TokenType)0x4ad30b);
    }
  } while( true );
}

Assistant:

void scanBlocks (FunctionParseState& state, FunctionBuilder& builder)
    {
        for (;;)
        {
            auto name = parseBlockName();

            for (auto& b : state.blocks)
                if (b.block.name == name)
                    throwError (Errors::nameInUse (name));

            auto& block = builder.createBlock (name);

            if (matchIf (HEARTOperator::openParen))
            {
                if (! matchIf (HEARTOperator::closeParen))
                {
                    for (;;)
                    {
                        auto paramType = readValueOrRefType();
                        auto paramLocation = location;
                        auto paramName = parseVariableIdentifier();
                        block.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), paramType, paramName, heart::Variable::Role::parameter));

                        if (matchIf (HEARTOperator::comma))
                            continue;

                        expect (HEARTOperator::closeParen);
                        break;
                    }
                }
            }

            expect (HEARTOperator::colon);
            state.blocks.push_back ({ block, getCurrentTokeniserPosition() });

            skipPastNextOccurrenceOf (HEARTOperator::semicolon);

            while (! matches (Token::blockIdentifier))
            {
                if (matchIf (HEARTOperator::closeBrace))
                    return;

                skipPastNextOccurrenceOf (HEARTOperator::semicolon);
            }
        }
    }